

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O3

void __thiscall
dgMatrix::TransformTriplex
          (dgMatrix *this,HaF32 *dst,HaI32 dstStrideInBytes,HaF32 *src,HaI32 srcStrideInBytes,
          HaI32 count)

{
  float fVar1;
  HaF32 HVar2;
  HaF32 HVar3;
  undefined1 auVar4 [16];
  HaF32 *pHVar5;
  float *pfVar6;
  
  if (0 < count) {
    pHVar5 = src + 2;
    pfVar6 = (float *)(dst + 2);
    do {
      fVar1 = (float)pHVar5[-1];
      HVar2 = pHVar5[-2];
      HVar3 = *pHVar5;
      pHVar5 = pHVar5 + (srcStrideInBytes >> 2);
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->m_up).super_dgTemplateVector<float>.m_x
                                             )),ZEXT416((uint)HVar2),
                               ZEXT416((uint)(this->m_front).super_dgTemplateVector<float>.m_x));
      auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)HVar3),
                               ZEXT416((uint)(this->m_right).super_dgTemplateVector<float>.m_x));
      pfVar6[-2] = auVar4._0_4_ + (this->m_posit).super_dgTemplateVector<float>.m_x;
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->m_up).super_dgTemplateVector<float>.m_y
                                             )),ZEXT416((uint)HVar2),
                               ZEXT416((uint)(this->m_front).super_dgTemplateVector<float>.m_y));
      auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)HVar3),
                               ZEXT416((uint)(this->m_right).super_dgTemplateVector<float>.m_y));
      pfVar6[-1] = auVar4._0_4_ + (this->m_posit).super_dgTemplateVector<float>.m_y;
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->m_up).super_dgTemplateVector<float>.m_z
                                             )),ZEXT416((uint)HVar2),
                               ZEXT416((uint)(this->m_front).super_dgTemplateVector<float>.m_z));
      auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)HVar3),
                               ZEXT416((uint)(this->m_right).super_dgTemplateVector<float>.m_z));
      *pfVar6 = auVar4._0_4_ + (this->m_posit).super_dgTemplateVector<float>.m_z;
      pfVar6 = pfVar6 + (dstStrideInBytes >> 2);
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void dgMatrix::TransformTriplex (hacd::HaF32* const dst, hacd::HaI32 dstStrideInBytes, const hacd::HaF32* const src, hacd::HaI32 srcStrideInBytes, hacd::HaI32 count) const
{
	hacd::HaI32 dstStride = dstStrideInBytes /sizeof (hacd::HaF32);
	hacd::HaI32 srcStride = srcStrideInBytes / sizeof (hacd::HaF32);

	hacd::HaI32 dstIndex = 0;
	hacd::HaI32 srcIndex = 0;
	for (hacd::HaI32 i = 0 ; i < count; i ++ ) {
		hacd::HaF32 x = src[srcIndex + 0];
		hacd::HaF32 y = src[srcIndex + 1];
		hacd::HaF32 z = src[srcIndex + 2];
		srcIndex += srcStride;
		dst[dstIndex + 0] = x * m_front.m_x + y * m_up.m_x + z * m_right.m_x + m_posit.m_x;
		dst[dstIndex + 1] = x * m_front.m_y + y * m_up.m_y + z * m_right.m_y + m_posit.m_y;
		dst[dstIndex + 2] = x * m_front.m_z + y * m_up.m_z + z * m_right.m_z + m_posit.m_z;
		dstIndex += dstStride;
	}
}